

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal)

{
  pointer pcVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmCustomCommandLine *__first1;
  cmCustomCommandLine *__last1;
  cmCustomCommandLine *__first2;
  bool bVar4;
  cmCustomCommand *pcVar5;
  cmCustomCommandLines *pcVar6;
  ostream *poVar7;
  cmSourceFile *pcVar8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *__y;
  string *sourceName;
  pointer pbVar9;
  pointer pcVar10;
  cmSourceFile *local_1f8;
  string local_1e8;
  string *local_1c8;
  size_type *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  cmCustomCommandLines *local_1b0;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmSystemTools::Error
              ("Attempt to add a custom rule with no output!",(char *)0x0,(char *)0x0,(char *)0x0);
    return (cmSourceFile *)0x0;
  }
  pcVar1 = (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar10 = pcVar1;
  local_1c8 = main_dependency;
  local_1b8 = depends;
  if (pcVar1 == pcVar2) {
    local_1c0 = &main_dependency->_M_string_length;
  }
  else {
    do {
      pbVar9 = (pcVar10->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((pbVar9 != (pcVar10->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) && (pbVar9->_M_string_length != 0)
          ) && (*(pbVar9->_M_dataplus)._M_p == '\"')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&e,"COMMAND may not contain literal quotes:\n  ",0x2a);
        pbVar9 = (pcVar10->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_138);
        goto LAB_003234e3;
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar2);
    local_1c0 = &main_dependency->_M_string_length;
    if ((pcVar1 != pcVar2) && (main_dependency->_M_string_length != 0)) {
      local_1f8 = GetSource(this,main_dependency);
      if (local_1f8 == (cmSourceFile *)0x0) {
        local_1f8 = CreateSource(this,main_dependency,false);
        if (local_1f8 != (cmSourceFile *)0x0) goto LAB_0032331b;
      }
      else {
        pcVar5 = cmSourceFile::GetCustomCommand(local_1f8);
        if (pcVar5 == (cmCustomCommand *)0x0 || replace) goto LAB_0032331b;
        pcVar5 = cmSourceFile::GetCustomCommand(local_1f8);
        __y = &cmCustomCommand::GetCommandLines(pcVar5)->
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar4 = std::operator==(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,__y);
        if (bVar4) {
          return local_1f8;
        }
      }
    }
  }
  pcVar3 = this->LocalGenerator->GlobalGenerator;
  (*pcVar3->_vptr_cmGlobalGenerator[0x1c])
            ((string *)&e,pcVar3,
             (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pcVar8 = GetSource(this,(string *)&e);
  if (pcVar8 == (cmSourceFile *)0x0) {
    local_1f8 = CreateSource(this,(string *)&e,true);
LAB_00323189:
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"__CMAKE_RULE","");
    cmSourceFile::SetProperty(local_1f8,&local_1e8,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
    pcVar8 = (cmSourceFile *)0x0;
  }
  else {
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar8);
    local_1f8 = pcVar8;
    if (pcVar5 == (cmCustomCommand *)0x0 || replace) goto LAB_00323189;
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar8);
    pcVar6 = cmCustomCommand::GetCommandLines(pcVar5);
    __first1 = (commandLines->
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
    __last1 = (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              ).super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    __first2 = (pcVar6->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 ==
         (long)(pcVar6->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)__first2) &&
       (bVar4 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (__first1,__last1,__first2), bVar4)) {
      bVar4 = false;
    }
    else {
      bVar4 = false;
      cmSystemTools::Error
                ("Attempt to add a custom rule to output \"",_e,
                 "\" which already has a custom rule.",(char *)0x0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_198) {
    operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return pcVar8;
  }
LAB_0032331b:
  sourceName = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = commandLines;
  if (sourceName !=
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar8 = GetOrCreateSource(this,sourceName,true);
      if (pcVar8 != (cmSourceFile *)0x0) {
        _e = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)&e,"GENERATED","");
        cmSourceFile::SetProperty(pcVar8,(string *)&e,"1");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
        }
      }
      sourceName = sourceName + 1;
    } while (sourceName !=
             (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar9 = (byproducts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar9 != (byproducts->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar8 = GetOrCreateSource(this,pbVar9,true);
      if (pcVar8 != (cmSourceFile *)0x0) {
        _e = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)&e,"GENERATED","");
        cmSourceFile::SetProperty(pcVar8,(string *)&e,"1");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
        }
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != (byproducts->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f8 == (cmSourceFile *)0x0) {
LAB_003234e3:
    local_1f8 = (cmSourceFile *)0x0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&e,local_1b8);
    if (*local_1c0 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&e,local_1c8);
    }
    pcVar5 = (cmCustomCommand *)operator_new(0xf0);
    cmCustomCommand::cmCustomCommand
              (pcVar5,this,outputs,byproducts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&e,local_1b0,comment,workingDir);
    cmCustomCommand::SetEscapeOldStyle(pcVar5,escapeOldStyle);
    cmCustomCommand::SetEscapeAllowMakeVars(pcVar5,true);
    cmCustomCommand::SetUsesTerminal(pcVar5,uses_terminal);
    cmSourceFile::SetCustomCommand(local_1f8,pcVar5);
    for (pbVar9 = (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar9 != (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      UpdateOutputToSourceMap(this,pbVar9,local_1f8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&e);
  }
  return local_1f8;
}

Assistant:

cmSourceFile*
cmMakefile::AddCustomCommandToOutput(const std::vector<std::string>& outputs,
                                  const std::vector<std::string>& byproducts,
                                     const std::vector<std::string>& depends,
                                     const std::string& main_dependency,
                                     const cmCustomCommandLines& commandLines,
                                     const char* comment,
                                     const char* workingDir,
                                     bool replace,
                                     bool escapeOldStyle,
                                     bool uses_terminal)
{
  // Make sure there is at least one output.
  if(outputs.empty())
    {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return 0;
    }

  // Validate custom commands.  TODO: More strict?
  for(cmCustomCommandLines::const_iterator i=commandLines.begin();
      i != commandLines.end(); ++i)
    {
    cmCustomCommandLine const& cl = *i;
    if(!cl.empty() && !cl[0].empty() && cl[0][0] == '"')
      {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return 0;
      }
    }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = 0;
  if(!commandLines.empty() && !main_dependency.empty())
    {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if(file && file->GetCustomCommand() && !replace)
      {
      // The main dependency already has a custom command.
      if(commandLines == file->GetCustomCommand()->GetCommandLines())
        {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
        }
      else
        {
        // The existing custom command is different.  We need to
        // generate a rule file for this new command.
        file = 0;
        }
      }
    else if (!file)
      {
      file = this->CreateSource(main_dependency);
      }
    }

  // Generate a rule file if the main dependency is not available.
  if(!file)
    {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName);
    if(file && file->GetCustomCommand() && !replace)
      {
      // The rule file already exists.
      if(commandLines != file->GetCustomCommand()->GetCommandLines())
        {
        cmSystemTools::Error("Attempt to add a custom rule to output \"",
                             outName.c_str(),
                             "\" which already has a custom rule.");
        }
      return file;
      }

    // Create a cmSourceFile for the rule file.
    if (!file)
      {
      file = this->CreateSource(outName, true);
      }
    file->SetProperty("__CMAKE_RULE", "1");
    }

  // Always create the output sources and mark them generated.
  for(std::vector<std::string>::const_iterator o = outputs.begin();
      o != outputs.end(); ++o)
    {
    if(cmSourceFile* out = this->GetOrCreateSource(*o, true))
      {
      out->SetProperty("GENERATED", "1");
      }
    }
  for(std::vector<std::string>::const_iterator o = byproducts.begin();
      o != byproducts.end(); ++o)
    {
    if(cmSourceFile* out = this->GetOrCreateSource(*o, true))
      {
      out->SetProperty("GENERATED", "1");
      }
    }

  // Attach the custom command to the file.
  if(file)
    {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if(!main_dependency.empty())
      {
      depends2.push_back(main_dependency);
      }

    cmCustomCommand* cc =
      new cmCustomCommand(this, outputs, byproducts, depends2,
                          commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
    }
  return file;
}